

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_body(Curl_easy *data,connectdata *conn,Curl_HttpReq httpreq,char **tep)

{
  HTTP *pHVar1;
  _Bool _Var2;
  CURLcode CVar3;
  curl_off_t cVar4;
  char *headerline;
  char *local_50;
  char *cthdr;
  HTTP *http;
  char *ptr;
  CURLcode result;
  char **tep_local;
  Curl_HttpReq httpreq_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  pHVar1 = (data->req).p.http;
  pHVar1->postsize = 0;
  if (httpreq == HTTPREQ_POST_FORM) {
    Curl_mime_cleanpart(&pHVar1->form);
    CVar3 = Curl_getformdata(data,&pHVar1->form,(data->set).httppost,(data->state).fread_func);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    pHVar1->sendit = &pHVar1->form;
  }
  else if (httpreq == HTTPREQ_POST_MIME) {
    pHVar1->sendit = &(data->set).mimepost;
  }
  else {
    pHVar1->sendit = (curl_mimepart *)0x0;
  }
  ptr._4_4_ = CURLE_OK;
  if (pHVar1->sendit != (curl_mimepart *)0x0) {
    local_50 = Curl_checkheaders(data,"Content-Type",0xc);
    pHVar1->sendit->flags = pHVar1->sendit->flags | 2;
    if (local_50 == (char *)0x0) {
      local_50 = (char *)0x0;
      if (pHVar1->sendit->kind == MIMEKIND_MULTIPART) {
        local_50 = "multipart/form-data";
      }
    }
    else {
      for (local_50 = local_50 + 0xd; *local_50 == ' '; local_50 = local_50 + 1) {
      }
    }
    curl_mime_headers(pHVar1->sendit,(data->set).headers,0);
    ptr._4_4_ = Curl_mime_prepare_headers(pHVar1->sendit,local_50,(char *)0x0,MIMESTRATEGY_FORM);
    curl_mime_headers(pHVar1->sendit,(curl_slist *)0x0,0);
    if (ptr._4_4_ == CURLE_OK) {
      ptr._4_4_ = Curl_mime_rewind(pHVar1->sendit);
    }
    if (ptr._4_4_ != CURLE_OK) {
      return ptr._4_4_;
    }
    cVar4 = Curl_mime_size(pHVar1->sendit);
    pHVar1->postsize = cVar4;
  }
  headerline = Curl_checkheaders(data,"Transfer-Encoding",0x11);
  if (headerline == (char *)0x0) {
    if (((conn->handler->protocol & 3) == 0) ||
       ((((httpreq != HTTPREQ_POST_MIME && (httpreq != HTTPREQ_POST_FORM)) ||
         (-1 < pHVar1->postsize)) &&
        ((((*(ulong *)&(data->set).field_0x8e2 >> 0x1a & 1) == 0 && (httpreq != HTTPREQ_POST)) ||
         ((data->state).infilesize != -1)))))) {
      *(ushort *)&(data->req).field_0xd9 = *(ushort *)&(data->req).field_0xd9 & 0xff7f;
    }
    else if ((*(uint *)&(conn->bits).field_0x4 >> 0x10 & 1) == 0) {
      _Var2 = Curl_use_http_1_1plus(data,conn);
      if (!_Var2) {
        Curl_failf(data,"Chunky upload is not supported by HTTP 1.0");
        return CURLE_UPLOAD_FAILED;
      }
      if (conn->httpversion < 0x14) {
        *(ushort *)&(data->req).field_0xd9 = *(ushort *)&(data->req).field_0xd9 & 0xff7f | 0x80;
      }
    }
    if ((*(ushort *)&(data->req).field_0xd9 >> 7 & 1) != 0) {
      *tep = "Transfer-Encoding: chunked\r\n";
    }
  }
  else {
    _Var2 = Curl_compareheader(headerline,"Transfer-Encoding:",0x12,"chunked",7);
    *(ushort *)&(data->req).field_0xd9 =
         *(ushort *)&(data->req).field_0xd9 & 0xff7f | (ushort)_Var2 << 7;
  }
  return ptr._4_4_;
}

Assistant:

CURLcode Curl_http_body(struct Curl_easy *data, struct connectdata *conn,
                        Curl_HttpReq httpreq, const char **tep)
{
  CURLcode result = CURLE_OK;
  const char *ptr;
  struct HTTP *http = data->req.p.http;
  http->postsize = 0;

  switch(httpreq) {
  case HTTPREQ_POST_MIME:
    http->sendit = &data->set.mimepost;
    break;
  case HTTPREQ_POST_FORM:
    /* Convert the form structure into a mime structure. */
    Curl_mime_cleanpart(&http->form);
    result = Curl_getformdata(data, &http->form, data->set.httppost,
                              data->state.fread_func);
    if(result)
      return result;
    http->sendit = &http->form;
    break;
  default:
    http->sendit = NULL;
  }

#ifndef CURL_DISABLE_MIME
  if(http->sendit) {
    const char *cthdr = Curl_checkheaders(data, STRCONST("Content-Type"));

    /* Read and seek body only. */
    http->sendit->flags |= MIME_BODY_ONLY;

    /* Prepare the mime structure headers & set content type. */

    if(cthdr)
      for(cthdr += 13; *cthdr == ' '; cthdr++)
        ;
    else if(http->sendit->kind == MIMEKIND_MULTIPART)
      cthdr = "multipart/form-data";

    curl_mime_headers(http->sendit, data->set.headers, 0);
    result = Curl_mime_prepare_headers(http->sendit, cthdr,
                                       NULL, MIMESTRATEGY_FORM);
    curl_mime_headers(http->sendit, NULL, 0);
    if(!result)
      result = Curl_mime_rewind(http->sendit);
    if(result)
      return result;
    http->postsize = Curl_mime_size(http->sendit);
  }
#endif

  ptr = Curl_checkheaders(data, STRCONST("Transfer-Encoding"));
  if(ptr) {
    /* Some kind of TE is requested, check if 'chunked' is chosen */
    data->req.upload_chunky =
      Curl_compareheader(ptr,
                         STRCONST("Transfer-Encoding:"), STRCONST("chunked"));
  }
  else {
    if((conn->handler->protocol & PROTO_FAMILY_HTTP) &&
       (((httpreq == HTTPREQ_POST_MIME || httpreq == HTTPREQ_POST_FORM) &&
         http->postsize < 0) ||
        ((data->set.upload || httpreq == HTTPREQ_POST) &&
         data->state.infilesize == -1))) {
      if(conn->bits.authneg)
        /* don't enable chunked during auth neg */
        ;
      else if(Curl_use_http_1_1plus(data, conn)) {
        if(conn->httpversion < 20)
          /* HTTP, upload, unknown file size and not HTTP 1.0 */
          data->req.upload_chunky = TRUE;
      }
      else {
        failf(data, "Chunky upload is not supported by HTTP 1.0");
        return CURLE_UPLOAD_FAILED;
      }
    }
    else {
      /* else, no chunky upload */
      data->req.upload_chunky = FALSE;
    }

    if(data->req.upload_chunky)
      *tep = "Transfer-Encoding: chunked\r\n";
  }
  return result;
}